

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u16 selFlags,
                         Expr *pLimit,Expr *pOffset)

{
  sqlite3 *db_00;
  Expr *pExpr;
  sqlite3 *db;
  Select standin;
  Select *pNew;
  Expr *pHaving_local;
  ExprList *pGroupBy_local;
  Expr *pWhere_local;
  SrcList *pSrc_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  standin.pOffset = (Expr *)sqlite3DbMallocZero(db_00,0x78);
  if (standin.pOffset == (Expr *)0x0) {
    standin.pOffset = (Expr *)&db;
    memset(standin.pOffset,0,0x78);
  }
  pSrc_local = (SrcList *)pEList;
  if (pEList == (ExprList *)0x0) {
    pExpr = sqlite3Expr(db_00,0x71,(char *)0x0);
    pSrc_local = (SrcList *)sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
  }
  *(SrcList **)standin.pOffset = pSrc_local;
  pWhere_local = (Expr *)pSrc;
  if (pSrc == (SrcList *)0x0) {
    pWhere_local = (Expr *)sqlite3DbMallocZero(db_00,0x70);
  }
  *(Expr **)&(standin.pOffset)->nHeight = pWhere_local;
  *(Expr **)&(standin.pOffset)->iColumn = pWhere;
  (standin.pOffset)->pAggInfo = (AggInfo *)pGroupBy;
  (standin.pOffset)->pTab = (Table *)pHaving;
  *(ExprList **)(standin.pOffset + 1) = pOrderBy;
  *(u16 *)((long)&(standin.pOffset)->u + 2) = selFlags;
  *(undefined1 *)&(standin.pOffset)->u = 0x74;
  standin.pOffset[1].x.pList = (ExprList *)pLimit;
  *(Expr **)&standin.pOffset[1].nHeight = pOffset;
  *(undefined4 *)((long)&(standin.pOffset)->pLeft + 4) = 0xffffffff;
  *(undefined4 *)&(standin.pOffset)->pRight = 0xffffffff;
  *(undefined4 *)((long)&(standin.pOffset)->pRight + 4) = 0xffffffff;
  if (db_00->mallocFailed != '\0') {
    clearSelect(db_00,(Select *)standin.pOffset);
    if (standin.pOffset != (Expr *)&db) {
      sqlite3DbFree(db_00,standin.pOffset);
    }
    standin.pOffset = (Expr *)0x0;
  }
  return (Select *)standin.pOffset;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u16 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit,         /* LIMIT value.  NULL means not used */
  Expr *pOffset         /* OFFSET value.  NULL means no offset */
){
  Select *pNew;
  Select standin;
  sqlite3 *db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  assert( db->mallocFailed || !pOffset || pLimit ); /* OFFSET implies LIMIT */
  if( pNew==0 ){
    assert( db->mallocFailed );
    pNew = &standin;
    memset(pNew, 0, sizeof(*pNew));
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db,TK_ALL,0));
  }
  pNew->pEList = pEList;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->selFlags = selFlags;
  pNew->op = TK_SELECT;
  pNew->pLimit = pLimit;
  pNew->pOffset = pOffset;
  assert( pOffset==0 || pLimit!=0 );
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->addrOpenEphm[2] = -1;
  if( db->mallocFailed ) {
    clearSelect(db, pNew);
    if( pNew!=&standin ) sqlite3DbFree(db, pNew);
    pNew = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  assert( pNew!=&standin );
  return pNew;
}